

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topic_manager.cpp
# Opt level: O3

int __thiscall miniros::TopicManager::shutdown(TopicManager *this,int __fd,int __how)

{
  recursive_mutex *__mutex;
  list<std::shared_ptr<miniros::Subscription>,_std::allocator<std::shared_ptr<miniros::Subscription>_>_>
  *this_00;
  pointer psVar1;
  Publication *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _List_node_base *p_Var3;
  Subscription *this_02;
  int iVar4;
  string *topic;
  int __how_00;
  pointer psVar5;
  pthread_mutex_t *__mutex_00;
  string local_60;
  pthread_mutex_t *local_40;
  pthread_mutex_t *local_38;
  
  __mutex_00 = (pthread_mutex_t *)&this->shutting_down_mutex_;
  iVar4 = pthread_mutex_lock(__mutex_00);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  if (this->shutting_down_ == false) {
    __mutex = &this->advertised_topics_mutex_;
    local_38 = __mutex_00;
    std::lock<std::mutex,std::recursive_mutex>(&this->subs_mutex_,__mutex);
    this->shutting_down_ = true;
    pthread_mutex_unlock((pthread_mutex_t *)this);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    observer::Connection::disconnect
              ((Connection *)
               (this->poll_watcher_)._M_t.
               super___uniq_ptr_impl<miniros::TopicManager::PollWatcher,_std::default_delete<miniros::TopicManager::PollWatcher>_>
               ._M_t.
               super__Tuple_impl<0UL,_miniros::TopicManager::PollWatcher_*,_std::default_delete<miniros::TopicManager::PollWatcher>_>
               .super__Head_base<0UL,_miniros::TopicManager::PollWatcher_*,_false>._M_head_impl);
    RPCManager::unbind((this->rpc_manager_).
                       super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       "publisherUpdate");
    RPCManager::unbind((this->rpc_manager_).
                       super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       "requestTopic");
    RPCManager::unbind((this->rpc_manager_).
                       super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       "getBusStats");
    RPCManager::unbind((this->rpc_manager_).
                       super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       "getBusInfo");
    RPCManager::unbind((this->rpc_manager_).
                       super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       "getSubscriptions");
    RPCManager::unbind((this->rpc_manager_).
                       super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       "getPublications");
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (shutdown::loc.initialized_ == false) {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"miniros.topic_manager","");
      console::initializeLogLocation(&shutdown::loc,&local_60,Debug);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    if (shutdown::loc.level_ != Debug) {
      console::setLogLocationLevel(&shutdown::loc,Debug);
      console::checkLogLocationEnabled(&shutdown::loc);
    }
    if (shutdown::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,shutdown::loc.logger_,shutdown::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/topic_manager.cpp"
                     ,0x96,"void miniros::TopicManager::shutdown()","Shutting down topics...");
    }
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (shutdown()::loc.initialized_ == false) {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"miniros.topic_manager","");
      console::initializeLogLocation(&shutdown()::loc,&local_60,Debug);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    if (shutdown()::loc.level_ != Debug) {
      console::setLogLocationLevel(&shutdown()::loc,Debug);
      console::checkLogLocationEnabled(&shutdown()::loc);
    }
    if (shutdown()::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,shutdown()::loc.logger_,shutdown()::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/topic_manager.cpp"
                     ,0x97,"void miniros::TopicManager::shutdown()","  shutting down publishers");
    }
    local_40 = (pthread_mutex_t *)__mutex;
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar4 != 0) {
      std::__throw_system_error(iVar4);
    }
    psVar1 = (this->advertised_topics_).
             super__Vector_base<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar5 = (this->advertised_topics_).
                  super__Vector_base<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar5 != psVar1; psVar5 = psVar5 + 1)
    {
      this_01 = (psVar5->super___shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
      p_Var2 = (psVar5->super___shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      if (this_01->dropped_ == false) {
        unregisterPublisher(this,&this_01->name_);
      }
      Publication::drop(this_01);
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
    }
    std::
    vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
    ::clear(&this->advertised_topics_);
    pthread_mutex_unlock(local_40);
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (shutdown()::loc.initialized_ == false) {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"miniros.topic_manager","");
      console::initializeLogLocation(&shutdown()::loc,&local_60,Debug);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    if (shutdown()::loc.level_ != Debug) {
      console::setLogLocationLevel(&shutdown()::loc,Debug);
      console::checkLogLocationEnabled(&shutdown()::loc);
    }
    if (shutdown()::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,shutdown()::loc.logger_,shutdown()::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/topic_manager.cpp"
                     ,0xa4,"void miniros::TopicManager::shutdown()","  shutting down subscribers");
    }
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)this);
    if (iVar4 != 0) {
      std::__throw_system_error(iVar4);
    }
    this_00 = &this->subscriptions_;
    for (p_Var3 = (this->subscriptions_).
                  super__List_base<std::shared_ptr<miniros::Subscription>,_std::allocator<std::shared_ptr<miniros::Subscription>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
        p_Var3 != (_List_node_base *)this_00; p_Var3 = p_Var3->_M_next) {
      this_02 = (Subscription *)p_Var3[1]._M_next;
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var3[1]._M_prev;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      topic = Subscription::getName_abi_cxx11_(this_02);
      unregisterSubscriber(this,topic);
      Subscription::shutdown(this_02,(int)topic,__how_00);
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
    }
    std::__cxx11::
    _List_base<std::shared_ptr<miniros::Subscription>,_std::allocator<std::shared_ptr<miniros::Subscription>_>_>
    ::_M_clear(&this_00->
                super__List_base<std::shared_ptr<miniros::Subscription>,_std::allocator<std::shared_ptr<miniros::Subscription>_>_>
              );
    (this->subscriptions_).
    super__List_base<std::shared_ptr<miniros::Subscription>,_std::allocator<std::shared_ptr<miniros::Subscription>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
    (this->subscriptions_).
    super__List_base<std::shared_ptr<miniros::Subscription>,_std::allocator<std::shared_ptr<miniros::Subscription>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
    (this->subscriptions_).
    super__List_base<std::shared_ptr<miniros::Subscription>,_std::allocator<std::shared_ptr<miniros::Subscription>_>_>
    ._M_impl._M_node._M_size = 0;
    pthread_mutex_unlock((pthread_mutex_t *)this);
    p_Var2 = (this->rpc_manager_).
             super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->rpc_manager_).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    (this->rpc_manager_).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    __mutex_00 = local_38;
    p_Var2 = (this->connection_manager_).
             super___shared_ptr<miniros::ConnectionManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (this->connection_manager_).
    super___shared_ptr<miniros::ConnectionManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->connection_manager_).
    super___shared_ptr<miniros::ConnectionManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    p_Var2 = (this->poll_manager_).
             super___shared_ptr<miniros::PollManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->poll_manager_).super___shared_ptr<miniros::PollManager,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (this->poll_manager_).super___shared_ptr<miniros::PollManager,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    p_Var2 = (this->master_link_).
             super___shared_ptr<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->master_link_).super___shared_ptr<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    (this->master_link_).super___shared_ptr<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
  }
  iVar4 = pthread_mutex_unlock(__mutex_00);
  return iVar4;
}

Assistant:

void TopicManager::shutdown()
{
  std::scoped_lock<std::mutex> shutdown_lock(shutting_down_mutex_);
  if (shutting_down_) {
    return;
  }

  {
    std::lock(subs_mutex_, advertised_topics_mutex_);
    shutting_down_ = true;
    subs_mutex_.unlock();
    advertised_topics_mutex_.unlock();
  }

  poll_watcher_->disconnect();

  rpc_manager_->unbind("publisherUpdate");
  rpc_manager_->unbind("requestTopic");
  rpc_manager_->unbind("getBusStats");
  rpc_manager_->unbind("getBusInfo");
  rpc_manager_->unbind("getSubscriptions");
  rpc_manager_->unbind("getPublications");

  MINIROS_DEBUG("Shutting down topics...");
  MINIROS_DEBUG("  shutting down publishers");
  {
    std::scoped_lock<std::recursive_mutex> adv_lock(advertised_topics_mutex_);

    for (PublicationPtr pub : advertised_topics_) {
      if (!pub->isDropped())
        unregisterPublisher(pub->getName());
      pub->drop();
    }
    advertised_topics_.clear();
  }

  // unregister all of our subscriptions
  MINIROS_DEBUG("  shutting down subscribers");
  {
    std::scoped_lock<std::mutex> subs_lock(subs_mutex_);

    for (SubscriptionPtr s : subscriptions_) {
      // Remove us as a subscriber from the master
      unregisterSubscriber(s->getName());
      // now, drop our side of the connection
      s->shutdown();
    }
    subscriptions_.clear();
  }

  rpc_manager_.reset();
  connection_manager_.reset();
  poll_manager_.reset();
  master_link_.reset();
}